

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O2

void ddst(int n,int isgn,double *a,int *ip,double *w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  long lVar5;
  int nc;
  int nw;
  long lVar6;
  
  uVar4 = (ulong)(uint)n;
  nw = *ip;
  if (nw * 4 < n) {
    nw = n >> 2;
    makewt(nw,ip,w);
  }
  nc = ip[1];
  if (ip[1] < n) {
    makect(n,ip,w + nw);
    nc = n;
  }
  lVar6 = (long)n;
  if (isgn < 0) {
    dVar1 = a[lVar6 + -1];
    for (; 3 < (int)uVar4; uVar4 = uVar4 - 2) {
      dVar2 = a[uVar4 - 3];
      dVar3 = a[uVar4 - 2];
      a[uVar4 - 2] = dVar3 - dVar2;
      (a + (uVar4 - 2))[1] = -dVar3 - dVar2;
    }
    a[1] = dVar1 + *a;
    *a = *a - dVar1;
    if (n < 5) {
      if (n == 4) {
        cftfsub(4,a,w);
      }
    }
    else {
      rftbsub(n,a,nc,w + nw);
      bitrv2(n,ip + 2,a);
      cftbsub(n,a,w);
    }
  }
  dstsub(n,a,nc,w + nw);
  if (-1 < isgn) {
    if (n < 5) {
      if (n == 4) {
        cftfsub(4,a,w);
      }
    }
    else {
      bitrv2(n,ip + 2,a);
      cftfsub(n,a,w);
      rftfsub(n,a,nc,w + nw);
    }
    dVar1 = *a;
    dVar2 = a[1];
    *a = dVar1 + dVar2;
    for (lVar5 = 3; lVar5 + -1 < lVar6; lVar5 = lVar5 + 2) {
      a[lVar5 + -2] = -a[lVar5 + -1] - a[lVar5];
      (a + lVar5 + -2)[1] = a[lVar5 + -1] - a[lVar5];
    }
    a[lVar6 + -1] = -(dVar1 - dVar2);
  }
  return;
}

Assistant:

void ddst(int n, int isgn, double *a, int *ip, double *w)
{
    void makewt(int nw, int *ip, double *w);
    void makect(int nc, int *ip, double *c);
    void bitrv2(int n, int *ip, double *a);
    void cftfsub(int n, double *a, double *w);
    void cftbsub(int n, double *a, double *w);
    void rftfsub(int n, double *a, int nc, double *c);
    void rftbsub(int n, double *a, int nc, double *c);
    void dstsub(int n, double *a, int nc, double *c);
    int j, nw, nc;
    double xr;
    
    nw = ip[0];
    if (n > (nw << 2)) {
        nw = n >> 2;
        makewt(nw, ip, w);
    }
    nc = ip[1];
    if (n > nc) {
        nc = n;
        makect(nc, ip, w + nw);
    }
    if (isgn < 0) {
        xr = a[n - 1];
        for (j = n - 2; j >= 2; j -= 2) {
            a[j + 1] = -a[j] - a[j - 1];
            a[j] -= a[j - 1];
        }
        a[1] = a[0] + xr;
        a[0] -= xr;
        if (n > 4) {
            rftbsub(n, a, nc, w + nw);
            bitrv2(n, ip + 2, a);
            cftbsub(n, a, w);
        } else if (n == 4) {
            cftfsub(n, a, w);
        }
    }
    dstsub(n, a, nc, w + nw);
    if (isgn >= 0) {
        if (n > 4) {
            bitrv2(n, ip + 2, a);
            cftfsub(n, a, w);
            rftfsub(n, a, nc, w + nw);
        } else if (n == 4) {
            cftfsub(n, a, w);
        }
        xr = a[0] - a[1];
        a[0] += a[1];
        for (j = 2; j < n; j += 2) {
            a[j - 1] = -a[j] - a[j + 1];
            a[j] -= a[j + 1];
        }
        a[n - 1] = -xr;
    }
}